

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

string * __thiscall CLI::App::help(string *__return_storage_ptr__,App *this,size_t wid,string *prev)

{
  App *this_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  __type _Var4;
  ulong uVar5;
  reference ppAVar6;
  ostream *poVar7;
  reference this_01;
  pointer pOVar8;
  pointer pAVar9;
  string *psVar10;
  size_type sVar11;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  reference local_4f8;
  App_p *new_com;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range4_1;
  string local_4c8;
  string local_4a8;
  key_type *local_488;
  string *group_key;
  App_p *com;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range3_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  string local_410;
  reference local_3f0;
  Option_p *opt_3;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range4;
  string local_3b0;
  reference local_390;
  string *group;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_350;
  string local_330;
  string local_310;
  reference local_2f0;
  Option_p *opt_2;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3;
  reference local_2b0;
  Option_p *opt_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2_1;
  bool pos;
  Option_p *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream local_220 [7];
  bool npos;
  stringstream out;
  ostream local_210 [380];
  undefined4 local_94;
  string local_90;
  undefined1 local_70 [8];
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *prev_local;
  size_t wid_local;
  App *this_local;
  
  local_28 = prev;
  prev_local = (string *)wid;
  wid_local = (size_t)this;
  this_local = (App *)__return_storage_ptr__;
  uVar5 = ::std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    ::std::operator+(&local_48," ",&this->name_);
    ::std::__cxx11::string::operator+=((string *)prev,(string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    ::std::__cxx11::string::operator=((string *)prev,(string *)&this->name_);
  }
  get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70,this,true);
  bVar1 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::empty
                    ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70);
  if (bVar1) {
    ::std::__cxx11::stringstream::stringstream(local_220);
    poVar7 = ::std::operator<<(local_210,(string *)&this->description_);
    ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
    poVar7 = ::std::operator<<(local_210,"Usage: ");
    ::std::operator<<(poVar7,(string *)prev);
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range2);
    __end2 = std::
             vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ::begin(&this->options_);
    opt = (Option_p *)
          std::
          vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ::end(&this->options_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                       *)&opt), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                ::operator*(&__end2);
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_01);
      bVar1 = Option::nonpositional(pOVar8);
      if (bVar1) {
        groups._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_01);
        psVar10 = OptionBase<CLI::Option>::get_group_abi_cxx11_
                            (&pOVar8->super_OptionBase<CLI::Option>);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,psVar10);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((groups._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
      ::std::operator<<(local_210," [OPTIONS]");
    }
    bVar1 = false;
    __end2_1 = std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::begin(&this->options_);
    opt_1 = (Option_p *)
            std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::end(&this->options_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               *)&opt_1), bVar2) {
      local_2b0 = __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                  ::operator*(&__end2_1);
      pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_2b0);
      bVar2 = Option::get_positional(pOVar8);
      if (bVar2) {
        poVar7 = ::std::operator<<(local_210," ");
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_2b0);
        Option::help_positional_abi_cxx11_((string *)&__range3,pOVar8);
        ::std::operator<<(poVar7,(string *)&__range3);
        ::std::__cxx11::string::~string((string *)&__range3);
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_2b0);
        bVar2 = Option::_has_help_positional(pOVar8);
        if (bVar2) {
          bVar1 = true;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&__end2_1);
    }
    bVar2 = std::
            vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
            ::empty(&this->subcommands_);
    if (!bVar2) {
      if (this->require_subcommand_min_ == 0) {
        ::std::operator<<(local_210," [SUBCOMMAND]");
      }
      else {
        ::std::operator<<(local_210," SUBCOMMAND");
      }
    }
    ::std::ostream::operator<<(local_210,::std::endl<char,std::char_traits<char>>);
    if (bVar1) {
      poVar7 = (ostream *)
               ::std::ostream::operator<<(local_210,::std::endl<char,std::char_traits<char>>);
      poVar7 = ::std::operator<<(poVar7,"Positionals:");
      ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
      __end3 = std::
               vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ::begin(&this->options_);
      opt_2 = (Option_p *)
              std::
              vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ::end(&this->options_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                         *)&opt_2), bVar1) {
        local_2f0 = __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    ::operator*(&__end3);
        pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_2f0);
        psVar10 = OptionBase<CLI::Option>::get_group_abi_cxx11_
                            (&pOVar8->super_OptionBase<CLI::Option>);
        ::std::__cxx11::string::string((string *)&local_330,(string *)psVar10);
        detail::to_lower(&local_310,&local_330);
        bVar3 = ::std::__cxx11::string::empty();
        ::std::__cxx11::string::~string((string *)&local_310);
        ::std::__cxx11::string::~string((string *)&local_330);
        if ((bVar3 & 1) == 0) {
          pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_2f0);
          bVar1 = Option::_has_help_positional(pOVar8);
          if (bVar1) {
            pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_2f0);
            Option::help_pname_abi_cxx11_(&local_350,pOVar8);
            pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_2f0);
            psVar10 = Option::get_description_abi_cxx11_(pOVar8);
            ::std::__cxx11::string::string((string *)&__range3_1,(string *)psVar10);
            detail::format_help((stringstream *)local_220,&local_350,(string *)&__range3_1,
                                (size_t)prev_local);
            ::std::__cxx11::string::~string((string *)&__range3_1);
            ::std::__cxx11::string::~string((string *)&local_350);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    if ((groups._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
      __end3_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2);
      group = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&group), bVar1) {
        local_390 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end3_1);
        ::std::__cxx11::string::string((string *)&__range4,(string *)local_390);
        detail::to_lower(&local_3b0,(string *)&__range4);
        bVar3 = ::std::__cxx11::string::empty();
        ::std::__cxx11::string::~string((string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&__range4);
        if ((bVar3 & 1) == 0) {
          poVar7 = (ostream *)
                   ::std::ostream::operator<<(local_210,::std::endl<char,std::char_traits<char>>);
          poVar7 = ::std::operator<<(poVar7,(string *)local_390);
          poVar7 = ::std::operator<<(poVar7,":");
          ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
          __end4 = std::
                   vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                   ::begin(&this->options_);
          opt_3 = (Option_p *)
                  std::
                  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ::end(&this->options_);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                             *)&opt_3), bVar1) {
            local_3f0 = __gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                        ::operator*(&__end4);
            pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_3f0);
            bVar1 = Option::nonpositional(pOVar8);
            if (bVar1) {
              pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                 (local_3f0);
              psVar10 = OptionBase<CLI::Option>::get_group_abi_cxx11_
                                  (&pOVar8->super_OptionBase<CLI::Option>);
              _Var4 = ::std::operator==(psVar10,local_390);
              if (_Var4) {
                pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                   (local_3f0);
                Option::help_name_abi_cxx11_(&local_410,pOVar8,true);
                pOVar8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                   (local_3f0);
                psVar10 = Option::get_description_abi_cxx11_(pOVar8);
                ::std::__cxx11::string::string
                          ((string *)
                           &subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (string *)psVar10);
                detail::format_help((stringstream *)local_220,&local_410,
                                    (string *)
                                    &subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,(size_t)prev_local);
                ::std::__cxx11::string::~string
                          ((string *)
                           &subcmd_groups_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::std::__cxx11::string::~string((string *)&local_410);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
            ::operator++(&__end4);
          }
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_1);
      }
    }
    bVar1 = std::
            vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
            ::empty(&this->subcommands_);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range3_2);
      __end3_2 = std::
                 vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                 ::begin(&this->subcommands_);
      com = (App_p *)std::
                     vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                     ::end(&this->subcommands_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                 *)&com), bVar1) {
        group_key = (string *)
                    __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                    ::operator*(&__end3_2);
        pAVar9 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->
                           ((unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *)group_key);
        psVar10 = get_group_abi_cxx11_(pAVar9);
        ::std::__cxx11::string::string((string *)&local_4c8,(string *)psVar10);
        detail::to_lower(&local_4a8,&local_4c8);
        ::std::__cxx11::string::~string((string *)&local_4c8);
        local_488 = &local_4a8;
        uVar5 = ::std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) &&
           (sVar11 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range3_2,local_488), sVar11 == 0)) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3_2,local_488);
          poVar7 = (ostream *)
                   ::std::ostream::operator<<(local_210,::std::endl<char,std::char_traits<char>>);
          pAVar9 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->
                             ((unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *)group_key);
          psVar10 = get_group_abi_cxx11_(pAVar9);
          poVar7 = ::std::operator<<(poVar7,(string *)psVar10);
          poVar7 = ::std::operator<<(poVar7,":");
          ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
          __end4_1 = std::
                     vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                     ::begin(&this->subcommands_);
          new_com = (App_p *)std::
                             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                             ::end(&this->subcommands_);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4_1,
                                    (__normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                     *)&new_com), bVar1) {
            local_4f8 = __gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                        ::operator*(&__end4_1);
            pAVar9 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->
                               (local_4f8);
            psVar10 = get_group_abi_cxx11_(pAVar9);
            ::std::__cxx11::string::string((string *)&local_538,(string *)psVar10);
            detail::to_lower(&local_518,&local_538);
            _Var4 = ::std::operator==(&local_518,local_488);
            ::std::__cxx11::string::~string((string *)&local_518);
            ::std::__cxx11::string::~string((string *)&local_538);
            if (_Var4) {
              pAVar9 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->
                                 (local_4f8);
              get_name_abi_cxx11_(&local_558,pAVar9);
              pAVar9 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->
                                 (local_4f8);
              ::std::__cxx11::string::string((string *)&local_578,(string *)&pAVar9->description_);
              detail::format_help((stringstream *)local_220,&local_558,&local_578,(size_t)prev_local
                                 );
              ::std::__cxx11::string::~string((string *)&local_578);
              ::std::__cxx11::string::~string((string *)&local_558);
            }
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
            ::operator++(&__end4_1);
          }
          local_94 = 0;
        }
        else {
          local_94 = 0xd;
        }
        ::std::__cxx11::string::~string((string *)&local_4a8);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
        ::operator++(&__end3_2);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3_2);
    }
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar7 = (ostream *)
               ::std::ostream::operator<<(local_210,::std::endl<char,std::char_traits<char>>);
      poVar7 = ::std::operator<<(poVar7,(string *)&this->footer_);
      ::std::ostream::operator<<(poVar7,::std::endl<char,std::char_traits<char>>);
    }
    ::std::__cxx11::stringstream::str();
    local_94 = 1;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
    ::std::__cxx11::stringstream::~stringstream(local_220);
  }
  else {
    ppAVar6 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70,0);
    psVar10 = prev_local;
    this_00 = *ppAVar6;
    ::std::__cxx11::string::string((string *)&local_90,(string *)prev);
    help(__return_storage_ptr__,this_00,(size_t)psVar10,&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
    local_94 = 1;
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string help(size_t wid = 30, std::string prev = "") const {
        // Delegate to subcommand if needed
        if(prev.empty())
            prev = name_;
        else
            prev += " " + name_;

        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(wid, prev);

        std::stringstream out;
        out << description_ << std::endl;
        out << "Usage: " << prev;

        // Check for options_
        bool npos = false;
        std::set<std::string> groups;
        for(const Option_p &opt : options_) {
            if(opt->nonpositional()) {
                npos = true;
                groups.insert(opt->get_group());
            }
        }

        if(npos)
            out << " [OPTIONS]";

        // Positionals
        bool pos = false;
        for(const Option_p &opt : options_)
            if(opt->get_positional()) {
                // A hidden positional should still show up in the usage statement
                // if(detail::to_lower(opt->get_group()).empty())
                //    continue;
                out << " " << opt->help_positional();
                if(opt->_has_help_positional())
                    pos = true;
            }

        if(!subcommands_.empty()) {
            if(require_subcommand_min_ > 0)
                out << " SUBCOMMAND";
            else
                out << " [SUBCOMMAND]";
        }

        out << std::endl;

        // Positional descriptions
        if(pos) {
            out << std::endl << "Positionals:" << std::endl;
            for(const Option_p &opt : options_) {
                if(detail::to_lower(opt->get_group()).empty())
                    continue; // Hidden
                if(opt->_has_help_positional())
                    detail::format_help(out, opt->help_pname(), opt->get_description(), wid);
            }
        }

        // Options
        if(npos) {
            for(const std::string &group : groups) {
                if(detail::to_lower(group).empty())
                    continue; // Hidden
                out << std::endl << group << ":" << std::endl;
                for(const Option_p &opt : options_) {
                    if(opt->nonpositional() && opt->get_group() == group)
                        detail::format_help(out, opt->help_name(true), opt->get_description(), wid);
                }
            }
        }

        // Subcommands
        if(!subcommands_.empty()) {
            std::set<std::string> subcmd_groups_seen;
            for(const App_p &com : subcommands_) {
                const std::string &group_key = detail::to_lower(com->get_group());
                if(group_key.empty() || subcmd_groups_seen.count(group_key) != 0)
                    continue; // Hidden or not in a group

                subcmd_groups_seen.insert(group_key);
                out << std::endl << com->get_group() << ":" << std::endl;
                for(const App_p &new_com : subcommands_)
                    if(detail::to_lower(new_com->get_group()) == group_key)
                        detail::format_help(out, new_com->get_name(), new_com->description_, wid);
            }
        }

        if(!footer_.empty()) {
            out << std::endl << footer_ << std::endl;
        }

        return out.str();
    }